

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

BinarySink * get_out_val_string_binarysink(BinarySource *in)

{
  Value *ctx;
  strbuf *psVar1;
  Value *val;
  BinarySource *in_local;
  
  ctx = value_new(VT_string);
  psVar1 = strbuf_new();
  (ctx->field_2).vu_string = psVar1;
  add_finaliser(finaliser_return_value,ctx);
  return ((ctx->field_2).vu_string)->binarysink_;
}

Assistant:

static BinarySink *get_out_val_string_binarysink(BinarySource *in)
{
    Value *val = value_new(VT_string);
    val->vu_string = strbuf_new();
    add_finaliser(finaliser_return_value, val);
    return BinarySink_UPCAST(val->vu_string);
}